

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzgnames.cpp
# Opt level: O3

int __thiscall
icu_63::TimeZoneGenericNames::clone
          (TimeZoneGenericNames *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  int32_t *piVar1;
  TZGNCoreRef *pTVar2;
  undefined8 *puVar3;
  
  puVar3 = (undefined8 *)UMemory::operator_new((UMemory *)0x10,(size_t)__fn);
  if (puVar3 != (undefined8 *)0x0) {
    *puVar3 = &PTR__TimeZoneGenericNames_003d3b90;
    puVar3[1] = 0;
    umtx_lock_63((UMutex *)gTZGNLock);
    pTVar2 = this->fRef;
    piVar1 = &pTVar2->refCount;
    *piVar1 = *piVar1 + 1;
    puVar3[1] = pTVar2;
    umtx_unlock_63((UMutex *)gTZGNLock);
  }
  return (int)puVar3;
}

Assistant:

TimeZoneGenericNames*
TimeZoneGenericNames::clone() const {
    TimeZoneGenericNames* other = new TimeZoneGenericNames();
    if (other) {
        umtx_lock(&gTZGNLock);
        {
            // Just increments the reference count
            fRef->refCount++;
            other->fRef = fRef;
        }
        umtx_unlock(&gTZGNLock);
    }
    return other;
}